

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void lws_pt_destroy(lws_context_per_thread *pt)

{
  lws_foreign_thread_pollfd *plVar1;
  lws_context_per_thread *vpt;
  lws_foreign_thread_pollfd *next;
  lws_foreign_thread_pollfd *ftp;
  lws_context_per_thread *pt_local;
  
  next = pt->foreign_pfd_list;
  while (next != (lws_foreign_thread_pollfd *)0x0) {
    plVar1 = next->next;
    lws_realloc(next,0,"lws_free");
    next = plVar1;
  }
  pt->foreign_pfd_list = (lws_foreign_thread_pollfd *)0x0;
  if (pt->pipe_wsi != (lws *)0x0) {
    lws_destroy_event_pipe(pt->pipe_wsi);
    pt->pipe_wsi = (lws *)0x0;
  }
  pt->pipe_wsi = (lws *)0x0;
  return;
}

Assistant:

static void
lws_pt_destroy(struct lws_context_per_thread *pt)
{
	volatile struct lws_foreign_thread_pollfd *ftp, *next;
	volatile struct lws_context_per_thread *vpt;
#if defined(LWS_WITH_CGI)
	lws_ctx_t ctx = pt->context;

		if (lws_rops_fidx(&role_ops_cgi, LWS_ROPS_pt_init_destroy))
			(lws_rops_func_fidx(&role_ops_cgi, LWS_ROPS_pt_init_destroy)).
				pt_init_destroy(ctx, NULL, pt, 1);
#endif
	vpt = (volatile struct lws_context_per_thread *)pt;
	ftp = vpt->foreign_pfd_list;
	while (ftp) {
		next = ftp->next;
		lws_free((void *)ftp);
		ftp = next;
	}
	vpt->foreign_pfd_list = NULL;

	lws_pt_lock(pt, __func__);
	if (pt->pipe_wsi) {
		lws_destroy_event_pipe(pt->pipe_wsi);
		pt->pipe_wsi = NULL;
	}

#if defined(LWS_WITH_SECURE_STREAMS)
	lws_dll2_foreach_safe(&pt->ss_owner, NULL, lws_ss_destroy_dll);

#if defined(LWS_WITH_SECURE_STREAMS_PROXY_API) && defined(LWS_WITH_CLIENT)
	lws_dll2_foreach_safe(&pt->ss_client_owner, NULL, lws_sspc_destroy_dll);
#endif

#if defined(LWS_WITH_SEQUENCER)
	lws_seq_destroy_all_on_pt(pt);
#endif


#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		while (pt->http.ah_list)
			_lws_destroy_ah(pt, pt->http.ah_list);
#endif

#endif

	lws_pt_unlock(pt);
	pt->pipe_wsi = NULL;

}